

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void write_modes_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,
                   TokenExtra **tok,TokenExtra *tok_end,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  SgrprojInfo *pSVar1;
  aom_cdf_prob *icdf;
  RestorationInfo *pRVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint8_t uVar6;
  ushort uVar7;
  ushort uVar8;
  aom_cdf_prob aVar9;
  RestorationType RVar10;
  RestorationType s;
  MB_MODE_INFO **ppMVar11;
  RestorationUnitInfo *pRVar12;
  FRAME_CONTEXT *pFVar13;
  SgrprojInfo *pSVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  byte bVar18;
  byte bVar19;
  short sVar20;
  ulong uVar21;
  RestorationUnitInfo **__n;
  int iVar22;
  long lVar23;
  aom_cdf_prob (*icdf_00) [11];
  TokenExtra *tok_end_00;
  uint uVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  PARTITION_CONTEXT *__s;
  int iVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  od_ec_enc *enc;
  int rcol0;
  int rrow1;
  int rcol1;
  int rrow0;
  int *in_stack_fffffffffffffed0;
  BLOCK_SIZE BVar32;
  int *in_stack_fffffffffffffed8;
  BLOCK_SIZE local_115;
  uint local_c0;
  uint local_ac;
  SgrprojInfo *local_a8;
  RestorationUnitInfo **local_a0;
  uint local_98;
  int local_94;
  int local_90;
  uint local_8c;
  ulong local_88;
  int local_7c;
  RestorationInfo *local_78;
  WienerInfo *local_70;
  od_ec_enc *local_68;
  SgrprojInfo *local_60;
  WienerInfo *local_58;
  AV1Common *local_50;
  long local_48;
  long local_40;
  SgrprojInfo *local_38;
  
  iVar16 = (cpi->common).mi_params.mi_rows;
  uVar29 = (uint)tok_end;
  if (iVar16 <= (int)uVar29) {
    return;
  }
  uVar31 = (ulong)(BLOCK_SIZE)mi_col;
  bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar31];
  bVar19 = bVar3 >> 1;
  iVar22 = (cpi->common).mi_params.mi_cols;
  local_115 = BLOCK_INVALID;
  if (mi_row < iVar22) {
    iVar17 = (cpi->common).mi_params.mi_stride;
    ppMVar11 = (cpi->common).mi_params.mi_grid_base;
    lVar23 = (long)(int)(iVar17 * uVar29 + mi_row);
    BVar32 = ppMVar11[lVar23]->bsize;
    if (BVar32 == (BLOCK_SIZE)mi_col) {
      bVar15 = 0;
LAB_00198790:
      switch(uVar31) {
      case 0:
        uVar21 = uVar31;
        break;
      case 1:
      case 2:
      case 4:
      case 5:
      case 7:
      case 8:
        goto switchD_001987a9_caseD_1;
      case 3:
        uVar21 = 1;
        break;
      case 6:
        uVar21 = 2;
        break;
      case 9:
        uVar21 = 3;
        break;
      default:
        if ((mi_col & 0xffU) == 0xc) {
          uVar21 = 4;
        }
        else {
          if ((mi_col & 0xffU) != 0xf) goto switchD_001987a9_caseD_1;
          uVar21 = 5;
        }
      }
      local_115 = subsize_lookup[bVar15][uVar21];
    }
    else {
      bVar18 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar31];
      bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar32];
      bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar32];
      if ((BLOCK_8X8 < (BLOCK_SIZE)mi_col) && ((int)(uVar29 + bVar19) < iVar16)) {
        if ((int)((uint)(bVar18 >> 1) + mi_row) < iVar22) {
          if (bVar5 == bVar3) {
            bVar15 = 8;
            if ((uint)bVar4 << 2 != (uint)bVar18) {
              bVar15 = (ppMVar11[lVar23 + (int)((uint)(bVar18 >> 1) * iVar17)]->bsize != BVar32) *
                       '\x04' + 1;
            }
          }
          else {
            local_c0 = (uint)bVar3;
            if (bVar4 == bVar18) {
              bVar15 = 9;
              if ((uint)bVar5 << 2 != local_c0) {
                bVar15 = (ppMVar11[lVar23 + (ulong)bVar19]->bsize != BVar32) * '\x05' + 2;
              }
            }
            else {
              bVar15 = 3;
              if (((uint)bVar4 * 2 == (uint)bVar18 && (uint)bVar5 * 2 == local_c0) &&
                 (bVar15 = 4,
                 "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [ppMVar11[lVar23 + (int)((uint)(bVar18 >> 1) * iVar17)]->bsize] != bVar3)) {
                bVar15 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [ppMVar11[lVar23 + (ulong)bVar19]->bsize] == bVar18) * '\x03' + 3;
              }
            }
          }
          goto LAB_00198790;
        }
      }
      lVar23 = (ulong)(bVar4 < bVar18) + (ulong)(bVar5 < bVar3) * 2;
      if (lVar23 != 0) {
        bVar15 = *(byte *)((long)&get_partition_base_partitions + lVar23);
        goto LAB_00198790;
      }
      bVar15 = 0xff;
    }
switchD_001987a9_caseD_1:
  }
  else {
    bVar15 = 0xff;
  }
  if ((cpi->common).mi_params.mi_cols <= mi_row) {
    return;
  }
  local_50 = &cpi->common;
  local_98 = (uint)(bVar3 >> 2);
  uVar6 = ((cpi->common).seq_params)->monochrome;
  local_78 = (cpi->common).rst_info;
  local_58 = (td->mb).e_mbd.wiener_info;
  local_60 = (td->mb).e_mbd.sgrproj_info;
  enc = &w->ec;
  uVar21 = 0;
  local_68 = enc;
  do {
    local_88 = uVar21;
    if (local_78[uVar21].frame_restoration_type != RESTORE_NONE) {
      in_stack_fffffffffffffed8 = &local_90;
      in_stack_fffffffffffffed0 = &local_7c;
      iVar16 = av1_loop_restoration_corners_in_sb
                         (local_50,(int)uVar21,uVar29,mi_row,(BLOCK_SIZE)mi_col,(int *)&local_ac,
                          (int *)&local_8c,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
      if ((iVar16 != 0) && (lVar23 = (long)local_7c, local_7c < local_90)) {
        pRVar2 = local_78 + uVar21;
        local_48 = (long)pRVar2->horz_units;
        local_a0 = &local_78[uVar21].unit_info;
        local_94 = (uint)(local_88 == 0) * 2 + 5;
        local_70 = local_58 + local_88;
        local_a8 = local_60 + local_88;
        uVar21 = (ulong)local_8c;
        iVar16 = local_90;
        do {
          lVar25 = (long)(int)local_ac;
          if ((int)local_ac < (int)uVar21) {
            lVar26 = lVar23 * local_48;
            local_40 = lVar23;
            do {
              pRVar12 = *local_a0;
              RVar10 = pRVar2->frame_restoration_type;
              s = pRVar12[lVar25 + lVar26].restoration_type;
              if (RVar10 == RESTORE_WIENER) {
                pFVar13 = (td->mb).e_mbd.tile_ctx;
                od_ec_encode_cdf_q15(enc,(uint)(s != RESTORE_NONE),pFVar13->wiener_restore_cdf,2);
                if (w->allow_update_cdf != '\0') {
                  uVar7 = pFVar13->wiener_restore_cdf[2];
                  bVar18 = (char)(uVar7 >> 4) + 4;
                  uVar8 = pFVar13->wiener_restore_cdf[0];
                  if (s == RESTORE_NONE) {
                    sVar20 = -(uVar8 >> (bVar18 & 0x1f));
                  }
                  else {
                    sVar20 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar18 & 0x1f));
                  }
                  pFVar13->wiener_restore_cdf[0] = sVar20 + uVar8;
                  pFVar13->wiener_restore_cdf[2] = uVar7 + (uVar7 < 0x20);
                }
                if (s != RESTORE_NONE) {
LAB_00198d9a:
                  write_wiener_filter(local_94,&pRVar12[lVar25 + lVar26].wiener_info,local_70,w);
                }
              }
              else if (RVar10 == RESTORE_SGRPROJ) {
                pFVar13 = (td->mb).e_mbd.tile_ctx;
                od_ec_encode_cdf_q15(enc,(uint)(s != RESTORE_NONE),pFVar13->sgrproj_restore_cdf,2);
                if (w->allow_update_cdf != '\0') {
                  uVar7 = pFVar13->sgrproj_restore_cdf[2];
                  bVar18 = (char)(uVar7 >> 4) + 4;
                  uVar8 = pFVar13->sgrproj_restore_cdf[0];
                  if (s == RESTORE_NONE) {
                    sVar20 = -(uVar8 >> (bVar18 & 0x1f));
                  }
                  else {
                    sVar20 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar18 & 0x1f));
                  }
                  pFVar13->sgrproj_restore_cdf[0] = sVar20 + uVar8;
                  pFVar13->sgrproj_restore_cdf[2] = uVar7 + (uVar7 < 0x20);
                }
                if (s != RESTORE_NONE) {
                  pSVar1 = &pRVar12[lVar25 + lVar26].sgrproj_info;
                  uVar24 = pRVar12[lVar25 + lVar26].sgrproj_info.ep;
                  uVar30 = 5;
                  do {
                    od_ec_encode_bool_q15
                              (enc,(uint)((uVar24 >> (uVar30 - 2 & 0x1f) & 1) != 0),0x4000);
                    uVar30 = uVar30 - 1;
                  } while (1 < uVar30);
                  iVar16 = pSVar1->ep;
                  if ((av1_sgr_params[iVar16].r[0] == 0) ||
                     (aom_write_primitive_refsubexpfin
                                (w,0x80,4,(short)local_a8->xqd[0] + 0x60,
                                 (short)pRVar12[lVar25 + lVar26].sgrproj_info.xqd[0] + 0x60),
                     av1_sgr_params[iVar16].r[1] != 0)) {
                    aom_write_primitive_refsubexpfin
                              (w,0x80,4,(short)local_a8->xqd[1] + 0x20,
                               (short)pRVar12[lVar25 + lVar26].sgrproj_info.xqd[1] + 0x20);
                  }
                  local_a8->xqd[1] = pRVar12[lVar25 + lVar26].sgrproj_info.xqd[1];
                  iVar16 = pSVar1->xqd[0];
                  local_a8->ep = pSVar1->ep;
                  local_a8->xqd[0] = iVar16;
                }
              }
              else if (RVar10 == RESTORE_SWITCHABLE) {
                pFVar13 = (td->mb).e_mbd.tile_ctx;
                icdf = pFVar13->switchable_restore_cdf;
                od_ec_encode_cdf_q15(enc,s,icdf,3);
                enc = local_68;
                if (w->allow_update_cdf != '\0') {
                  uVar7 = pFVar13->switchable_restore_cdf[3];
                  bVar18 = (char)(uVar7 >> 4) + 4;
                  lVar23 = 0;
                  do {
                    uVar8 = icdf[lVar23];
                    if (lVar23 < (char)s) {
                      sVar20 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar18 & 0x1f));
                    }
                    else {
                      sVar20 = -(uVar8 >> (bVar18 & 0x1f));
                    }
                    icdf[lVar23] = sVar20 + uVar8;
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != 2);
                  pFVar13->switchable_restore_cdf[3] =
                       pFVar13->switchable_restore_cdf[3] + (ushort)(uVar7 < 0x20);
                }
                if (s == RESTORE_SGRPROJ) {
                  pSVar1 = &pRVar12[lVar25 + lVar26].sgrproj_info;
                  uVar24 = pRVar12[lVar25 + lVar26].sgrproj_info.ep;
                  uVar30 = 5;
                  do {
                    od_ec_encode_bool_q15
                              (enc,(uint)((uVar24 >> (uVar30 - 2 & 0x1f) & 1) != 0),0x4000);
                    pSVar14 = local_a8;
                    uVar30 = uVar30 - 1;
                  } while (1 < uVar30);
                  iVar16 = pSVar1->ep;
                  local_38 = pSVar1;
                  if ((av1_sgr_params[iVar16].r[0] == 0) ||
                     (aom_write_primitive_refsubexpfin
                                (w,0x80,4,(short)local_a8->xqd[0] + 0x60,
                                 (short)pRVar12[lVar25 + lVar26].sgrproj_info.xqd[0] + 0x60),
                     av1_sgr_params[iVar16].r[1] != 0)) {
                    aom_write_primitive_refsubexpfin
                              (w,0x80,4,(short)pSVar14->xqd[1] + 0x20,
                               (short)pRVar12[lVar25 + lVar26].sgrproj_info.xqd[1] + 0x20);
                  }
                  pSVar14->xqd[1] = local_38->xqd[1];
                  iVar16 = local_38->xqd[0];
                  pSVar14->ep = local_38->ep;
                  pSVar14->xqd[0] = iVar16;
                }
                else if (s == RESTORE_WIENER) goto LAB_00198d9a;
              }
              lVar25 = lVar25 + 1;
              uVar21 = (ulong)(int)local_8c;
              lVar23 = local_40;
              iVar16 = local_90;
            } while (lVar25 < (long)uVar21);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < iVar16);
      }
    }
    BVar32 = (BLOCK_SIZE)in_stack_fffffffffffffed8;
  } while ((uVar6 == '\0') && (uVar21 = local_88 + 1, local_88 < 2));
  uVar24 = (uint)bVar19;
  if (BLOCK_8X4 < (BLOCK_SIZE)mi_col) {
    iVar17 = uVar24 + uVar29;
    iVar16 = (cpi->common).mi_params.mi_rows;
    iVar22 = (cpi->common).mi_params.mi_cols;
    iVar27 = uVar24 + mi_row;
    lVar23 = (ulong)""[uVar31] - 1;
    if (iVar27 < iVar22 || iVar17 < iVar16) {
      lVar23 = (ulong)((uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_row] >>
                               ((uint)lVar23 & 0x1f) & 1) != 0) +
                      ((uint)(int)(td->mb).e_mbd.left_partition_context[uVar29 & 0x1f] >>
                       ((byte)lVar23 & 0x1f) & 1) * 2) + (ulong)""[uVar31] * 4;
      iVar28 = (int)lVar23 + -4;
      pFVar13 = (td->mb).e_mbd.tile_ctx;
      if (iVar17 < iVar16 && iVar27 < iVar22) {
        icdf_00 = pFVar13->partition_cdf + lVar23 + -4;
        uVar30 = 4;
        if ((BLOCK_SIZE)mi_col != BLOCK_8X8) {
          uVar30 = ((BLOCK_SIZE)mi_col != BLOCK_128X128) + 8 +
                   (uint)((BLOCK_SIZE)mi_col != BLOCK_128X128);
        }
        od_ec_encode_cdf_q15(enc,(uint)bVar15,*icdf_00,uVar30);
        if (w->allow_update_cdf != '\0') {
          uVar7 = (*icdf_00)[uVar30];
          bVar19 = (char)(uVar7 >> 4) + 5;
          uVar21 = 0;
          do {
            uVar8 = (*icdf_00)[uVar21];
            if ((long)uVar21 < (long)(char)bVar15) {
              sVar20 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar19 & 0x1f));
            }
            else {
              sVar20 = -(uVar8 >> (bVar19 & 0x1f));
            }
            (*icdf_00)[uVar21] = sVar20 + uVar8;
            uVar21 = uVar21 + 1;
          } while (uVar30 - 1 != uVar21);
          (*icdf_00)[uVar30] = (*icdf_00)[uVar30] + (ushort)(uVar7 < 0x20);
        }
      }
      else {
        if (iVar17 < iVar16 || iVar22 <= iVar27) {
          sVar20 = ((pFVar13->partition_cdf[iVar28][1] - pFVar13->partition_cdf[iVar28][0] ^ 0x8000)
                   - pFVar13->partition_cdf[iVar28][2]) + pFVar13->partition_cdf[iVar28][6];
          if ((BLOCK_SIZE)mi_col != BLOCK_128X128) {
            sVar20 = (sVar20 - pFVar13->partition_cdf[iVar28][7]) +
                     pFVar13->partition_cdf[iVar28][8];
          }
        }
        else {
          aVar9 = pFVar13->partition_cdf[iVar28][2];
          sVar20 = (((aVar9 - pFVar13->partition_cdf[iVar28][1]) + pFVar13->partition_cdf[iVar28][4]
                    ) - (aVar9 + pFVar13->partition_cdf[iVar28][5])) +
                   pFVar13->partition_cdf[iVar28][7] + -0x8000;
          if ((BLOCK_SIZE)mi_col != BLOCK_128X128) {
            sVar20 = (sVar20 - pFVar13->partition_cdf[iVar28][8]) +
                     pFVar13->partition_cdf[iVar28][9];
          }
        }
        local_ac = (uint)(ushort)(0x8000 - sVar20);
        od_ec_encode_cdf_q15(enc,(uint)(bVar15 == 3),(uint16_t *)&local_ac,2);
      }
    }
  }
  iVar22 = (int)in_stack_fffffffffffffed0;
  iVar16 = mi_row;
  switch(bVar15) {
  case 0:
    goto LAB_0019942d;
  case 1:
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row,iVar22);
    tok_end = (TokenExtra *)(ulong)(uVar24 + uVar29);
    if ((int)(uVar24 + uVar29) < (cpi->common).mi_params.mi_rows) goto LAB_0019942d;
    break;
  case 2:
    write_modes_b(cpi,td,tile,w,tok,tok_end,mi_row,iVar22);
    iVar16 = uVar24 + mi_row;
    if (iVar16 < (cpi->common).mi_params.mi_cols) goto LAB_0019942d;
    break;
  case 3:
    local_a0 = (RestorationUnitInfo **)CONCAT44(local_a0._4_4_,(uint)local_115);
    write_modes_sb(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row,
                   (uint)local_115,BVar32);
    write_modes_sb(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row + uVar24,
                   (uint)local_115,BVar32);
    iVar16 = (int)local_a0;
    write_modes_sb(cpi,td,tile,w,tok,(TokenExtra *)(ulong)(uVar24 + uVar29),mi_row,(int)local_a0,
                   BVar32);
    write_modes_sb(cpi,td,tile,w,tok,(TokenExtra *)(ulong)(uVar24 + uVar29),mi_row + uVar24,iVar16,
                   BVar32);
    break;
  case 4:
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row,iVar22);
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row + uVar24,
                  iVar22);
    goto LAB_001992e6;
  case 5:
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row,iVar22);
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)(ulong)(uVar29 + uVar24),mi_row,iVar22);
    tok_end = (TokenExtra *)(ulong)(uVar29 + uVar24);
    iVar16 = uVar24 + mi_row;
    goto LAB_0019942d;
  case 6:
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row,iVar22);
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)(ulong)(uVar29 + uVar24),mi_row,iVar22);
    tok_end = (TokenExtra *)((ulong)tok_end & 0xffffffff);
    iVar16 = uVar24 + mi_row;
    goto LAB_0019942d;
  case 7:
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row,iVar22);
    write_modes_b(cpi,td,tile,w,tok,(TokenExtra *)((ulong)tok_end & 0xffffffff),mi_row + uVar24,
                  iVar22);
    iVar16 = mi_row + uVar24;
LAB_001992e6:
    tok_end = (TokenExtra *)(ulong)(uVar24 + uVar29);
LAB_0019942d:
    write_modes_b(cpi,td,tile,w,tok,tok_end,iVar16,iVar22);
    break;
  case 8:
    iVar16 = 4;
    tok_end_00 = (TokenExtra *)((ulong)tok_end & 0xffffffff);
    do {
      if ((iVar16 != 4) && ((cpi->common).mi_params.mi_rows <= (int)tok_end_00)) break;
      write_modes_b(cpi,td,tile,w,tok,tok_end_00,mi_row,(int)in_stack_fffffffffffffed0);
      tok_end_00 = (TokenExtra *)(ulong)((int)tok_end_00 + local_98);
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    break;
  case 9:
    iVar22 = 4;
    do {
      if ((iVar22 != 4) && ((cpi->common).mi_params.mi_cols <= iVar16)) break;
      write_modes_b(cpi,td,tile,w,tok,tok_end,iVar16,(int)in_stack_fffffffffffffed0);
      iVar16 = iVar16 + local_98;
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
  }
  if ((BLOCK_SIZE)mi_col < BLOCK_8X8) {
    return;
  }
  uVar21 = 0xff;
  switch(mi_col & 0xffU) {
  case 6:
    lVar23 = 2;
    break;
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
    goto switchD_00199464_caseD_7;
  case 9:
    lVar23 = 3;
    break;
  case 0xc:
    lVar23 = 4;
    break;
  case 0xf:
    lVar23 = 5;
    break;
  default:
    lVar23 = 1;
    if ((mi_col & 0xffU) != 3) goto switchD_00199464_caseD_7;
  }
  uVar21 = (ulong)subsize_lookup[3][lVar23];
switchD_00199464_caseD_7:
  if (bVar15 < 10) {
    uVar24 = (uint)(bVar3 >> 1);
    switch(bVar15) {
    case 3:
      if ((BLOCK_SIZE)mi_col != BLOCK_8X8) {
        return;
      }
    default:
      __s = (td->mb).e_mbd.left_partition_context + (uVar29 & 0x1f);
      __n = (RestorationUnitInfo **)
            (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar31];
      memset((td->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[local_115].above,(ulong)bVar3);
      uVar29 = (uint)(byte)partition_context_lookup[local_115].left;
      break;
    case 4:
      uVar31 = (ulong)local_115;
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar31];
      local_a0 = (RestorationUnitInfo **)
                 (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [uVar31];
      memset((td->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar21].above,(ulong)bVar3);
      __n = local_a0;
      memset((td->mb).e_mbd.left_partition_context + (uVar29 & 0x1f),
             (uint)(byte)partition_context_lookup[uVar21].left,(size_t)local_a0);
      __s = (td->mb).e_mbd.left_partition_context + (uVar24 + uVar29 & 0x1f);
      memset((td->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar31].above,(ulong)bVar3);
      uVar29 = (uint)(byte)partition_context_lookup[uVar31].left;
      break;
    case 5:
      uVar31 = (ulong)local_115;
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar31];
      __n = (RestorationUnitInfo **)
            (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar31];
      memset((td->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar31].above,(ulong)bVar3);
      memset((td->mb).e_mbd.left_partition_context + (uVar29 & 0x1f),
             (uint)(byte)partition_context_lookup[uVar31].left,(size_t)__n);
      __s = (td->mb).e_mbd.left_partition_context + (uVar24 + uVar29 & 0x1f);
      memset((td->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar21].above,(ulong)bVar3);
      uVar29 = (uint)(byte)partition_context_lookup[uVar21].left;
      break;
    case 6:
      __s = (td->mb).e_mbd.left_partition_context + (uVar29 & 0x1f);
      uVar31 = (ulong)local_115;
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar31];
      __n = (RestorationUnitInfo **)
            (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar31];
      memset((td->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar21].above,(ulong)bVar3);
      memset(__s,(uint)(byte)partition_context_lookup[uVar21].left,(size_t)__n);
      memset((td->mb).e_mbd.above_partition_context + (int)(uVar24 + mi_row),
             (uint)(byte)partition_context_lookup[uVar31].above,(ulong)bVar3);
      uVar29 = (uint)(byte)partition_context_lookup[uVar31].left;
      break;
    case 7:
      __s = (td->mb).e_mbd.left_partition_context + (uVar29 & 0x1f);
      uVar31 = (ulong)local_115;
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar31];
      __n = (RestorationUnitInfo **)
            (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar31];
      memset((td->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar31].above,(ulong)bVar3);
      memset(__s,(uint)(byte)partition_context_lookup[uVar31].left,(size_t)__n);
      memset((td->mb).e_mbd.above_partition_context + (int)(uVar24 + mi_row),
             (uint)(byte)partition_context_lookup[uVar21].above,(ulong)bVar3);
      uVar29 = (uint)(byte)partition_context_lookup[uVar21].left;
    }
    memset(__s,uVar29,(size_t)__n);
  }
  return;
}

Assistant:

static inline void write_modes_sb(AV1_COMP *const cpi, ThreadData *const td,
                                  const TileInfo *const tile,
                                  aom_writer *const w, const TokenExtra **tok,
                                  const TokenExtra *const tok_end, int mi_row,
                                  int mi_col, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCKD *const xd = &td->mb.e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int hbs = mi_size_wide[bsize] / 2;
  const int quarter_step = mi_size_wide[bsize] / 4;
  int i;
  const PARTITION_TYPE partition = get_partition(cm, mi_row, mi_col, bsize);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

#if !CONFIG_REALTIME_ONLY
  const int num_planes = av1_num_planes(cm);
  for (int plane = 0; plane < num_planes; ++plane) {
    int rcol0, rcol1, rrow0, rrow1;

    // Skip some unnecessary work if loop restoration is disabled
    if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

    if (av1_loop_restoration_corners_in_sb(cm, plane, mi_row, mi_col, bsize,
                                           &rcol0, &rcol1, &rrow0, &rrow1)) {
      const int rstride = cm->rst_info[plane].horz_units;
      for (int rrow = rrow0; rrow < rrow1; ++rrow) {
        for (int rcol = rcol0; rcol < rcol1; ++rcol) {
          const int runit_idx = rcol + rrow * rstride;
          loop_restoration_write_sb_coeffs(cm, xd, runit_idx, w, plane,
                                           td->counts);
        }
      }
    }
  }
#endif

  write_partition(cm, xd, hbs, mi_row, mi_col, partition, bsize, w);
  switch (partition) {
    case PARTITION_NONE:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      break;
    case PARTITION_HORZ:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      if (mi_row + hbs < mi_params->mi_rows)
        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      break;
    case PARTITION_VERT:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      if (mi_col + hbs < mi_params->mi_cols)
        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      break;
    case PARTITION_SPLIT:
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row, mi_col, subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs,
                     subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col,
                     subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs,
                     subsize);
      break;
    case PARTITION_HORZ_A:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      break;
    case PARTITION_HORZ_B:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_VERT_A:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      break;
    case PARTITION_VERT_B:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_HORZ_4:
      for (i = 0; i < 4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= mi_params->mi_rows) break;

        write_modes_b(cpi, td, tile, w, tok, tok_end, this_mi_row, mi_col);
      }
      break;
    case PARTITION_VERT_4:
      for (i = 0; i < 4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= mi_params->mi_cols) break;

        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, this_mi_col);
      }
      break;
    default: assert(0);
  }

  // update partition context
  update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}